

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestHG.cxx
# Opt level: O0

bool __thiscall cmCTestHG::LoadRevisions(cmCTestHG *this)

{
  undefined1 *this_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_450;
  string local_3e8;
  undefined1 local_3c8 [8];
  OutputLogger err;
  LogParser out;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  string local_190 [32];
  string local_170 [32];
  string local_150 [32];
  string local_130 [32];
  string local_110 [32];
  string local_f0 [32];
  iterator local_d0;
  size_type local_c8;
  undefined1 local_c0 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  hg_log;
  string local_a0 [8];
  string hgXMLTemplate;
  string hg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  undefined1 local_30 [8];
  string range;
  cmCTestHG *this_local;
  
  range.field_2._8_8_ = this;
  std::operator+(&local_50,&(this->super_cmCTestGlobalVC).OldRevision,":");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30,
                 &local_50,&(this->super_cmCTestGlobalVC).NewRevision);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::string
            ((string *)(hgXMLTemplate.field_2._M_local_buf + 8),
             (string *)&(this->super_cmCTestGlobalVC).super_cmCTestVC.CommandLineTool);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_a0,
             "<logentry\n   revision=\"{node|short}\">\n  <author>{author|person}</author>\n  <email>{author|email}</email>\n  <date>{date|isodate}</date>\n  <msg>{desc}</msg>\n  <files>{files}</files>\n  <file_adds>{file_adds}</file_adds>\n  <file_dels>{file_dels}</file_dels>\n</logentry>\n"
             ,(allocator<char> *)
              ((long)&hg_log.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&hg_log.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  out.CData.super__Vector_base<char,_std::allocator<char>_>._M_impl._19_1_ = 1;
  std::__cxx11::string::string
            ((string *)&local_1b0,(string *)(hgXMLTemplate.field_2._M_local_buf + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_190,"log",
             (allocator<char> *)
             &out.CData.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x17);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_170,"--removed",
             (allocator<char> *)
             &out.CData.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x16);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_150,"-r",
             (allocator<char> *)
             &out.CData.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x15);
  std::__cxx11::string::string(local_130,(string *)local_30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_110,"--template",
             (allocator<char> *)
             &out.CData.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x14);
  std::__cxx11::string::string(local_f0,local_a0);
  out.CData.super__Vector_base<char,_std::allocator<char>_>._M_impl._19_1_ = 0;
  local_d0 = &local_1b0;
  local_c8 = 7;
  this_00 = &out.CData.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x12;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)this_00);
  __l._M_len = local_c8;
  __l._M_array = local_d0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_c0,__l,(allocator_type *)this_00);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&out.CData.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x12);
  local_450 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_d0;
  do {
    local_450 = local_450 + -1;
    std::__cxx11::string::~string((string *)local_450);
  } while (local_450 != &local_1b0);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             &out.CData.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x14);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             &out.CData.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x15);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             &out.CData.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x16);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             &out.CData.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x17);
  LogParser::LogParser((LogParser *)&err.super_LineParser.Separator,this,"log-out> ");
  cmProcessTools::OutputParser::Process
            ((OutputParser *)&err.super_LineParser.Separator,"<?xml version=\"1.0\"?>\n<log>\n");
  cmProcessTools::OutputLogger::OutputLogger
            ((OutputLogger *)local_3c8,(this->super_cmCTestGlobalVC).super_cmCTestVC.Log,"log-err> "
            );
  std::__cxx11::string::string((string *)&local_3e8);
  cmCTestVC::RunChild((cmCTestVC *)this,
                      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_c0,(OutputParser *)&err.super_LineParser.Separator,
                      (OutputParser *)local_3c8,&local_3e8,Auto);
  std::__cxx11::string::~string((string *)&local_3e8);
  cmProcessTools::OutputParser::Process((OutputParser *)&err.super_LineParser.Separator,"</log>\n");
  cmProcessTools::OutputLogger::~OutputLogger((OutputLogger *)local_3c8);
  LogParser::~LogParser((LogParser *)&err.super_LineParser.Separator);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_c0);
  std::__cxx11::string::~string(local_a0);
  std::__cxx11::string::~string((string *)(hgXMLTemplate.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_30);
  return true;
}

Assistant:

bool cmCTestHG::LoadRevisions()
{
  // Use 'hg log' to get revisions in a xml format.
  //
  // TODO: This should use plumbing or python code to be more precise.
  // The "list of strings" templates like {files} will not work when
  // the project has spaces in the path.  Also, they may not have
  // proper XML escapes.
  std::string range = this->OldRevision + ":" + this->NewRevision;
  std::string hg = this->CommandLineTool;
  std::string hgXMLTemplate = "<logentry\n"
                              "   revision=\"{node|short}\">\n"
                              "  <author>{author|person}</author>\n"
                              "  <email>{author|email}</email>\n"
                              "  <date>{date|isodate}</date>\n"
                              "  <msg>{desc}</msg>\n"
                              "  <files>{files}</files>\n"
                              "  <file_adds>{file_adds}</file_adds>\n"
                              "  <file_dels>{file_dels}</file_dels>\n"
                              "</logentry>\n";
  std::vector<std::string> hg_log = { hg,    "log",        "--removed",  "-r",
                                      range, "--template", hgXMLTemplate };

  LogParser out(this, "log-out> ");
  out.Process("<?xml version=\"1.0\"?>\n"
              "<log>\n");
  OutputLogger err(this->Log, "log-err> ");
  this->RunChild(hg_log, &out, &err);
  out.Process("</log>\n");
  return true;
}